

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool medit_vuln(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  if (*argument != '\0') {
    pvVar1 = ch->desc->pEdit;
    iVar2 = flag_value(vuln_flags,argument);
    if (iVar2 != -99) {
      lVar4 = (long)(iVar2 / 0x20);
      uVar3 = *(ulong *)((long)pvVar1 + lVar4 * 8 + 0xf0);
      dVar5 = ldexp(1.0,iVar2 % 0x20);
      dVar6 = ldexp(1.0,iVar2 % 0x20);
      if ((uVar3 & (long)dVar5) == 0) {
        uVar3 = (long)dVar6 | *(ulong *)((long)pvVar1 + lVar4 * 8 + 0xf0);
      }
      else {
        uVar3 = ~(long)dVar6 & *(ulong *)((long)pvVar1 + lVar4 * 8 + 0xf0);
      }
      *(ulong *)((long)pvVar1 + lVar4 * 8 + 0xf0) = uVar3;
      send_to_char("Vulnerability toggled.\n\r",ch);
      return true;
    }
  }
  send_to_char("Syntax: vuln [flags]\n\rType \'? vuln\' for a list of flags.\n\r",ch);
  return false;
}

Assistant:

bool medit_vuln(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int value;

	if (argument[0] != '\0')
	{
		EDIT_MOB(ch, pMob);

		value = flag_value(vuln_flags, argument);

		if (value != NO_FLAG)
		{
			TOGGLE_BIT(pMob->vuln_flags, value);
			send_to_char("Vulnerability toggled.\n\r", ch);
			return true;
		}
	}

	send_to_char("Syntax: vuln [flags]\n\r"\
				 "Type '? vuln' for a list of flags.\n\r",
				 ch);
	return false;
}